

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O3

void miniros::setThreadName(char *threadName)

{
  prctl(0xf,threadName,0,0,0);
  return;
}

Assistant:

void setThreadName(const char* threadName) {
#if defined(_WIN32)
  // TODO: Implement.
#elif defined(__linux__)
  prctl(PR_SET_NAME, threadName,0,0,0);
#else
  pthread_t handle = pthread_self();
  pthread_setname_np(handle, threadName);
#endif
}